

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O3

void __thiscall
kj::MainBuilder::MainImpl::operator()
          (MainImpl *this,StringPtr programName,ArrayPtr<const_kj::StringPtr> params)

{
  char cVar1;
  _Base_ptr p_Var2;
  int *piVar3;
  StringPtr programName_00;
  StringPtr programName_01;
  StringPtr programName_02;
  StringPtr programName_03;
  StringPtr programName_04;
  StringPtr programName_05;
  StringPtr programName_06;
  StringPtr programName_07;
  StringPtr programName_08;
  StringPtr programName_09;
  StringPtr programName_10;
  StringPtr programName_11;
  StringPtr programName_12;
  StringPtr programName_13;
  StringPtr programName_14;
  StringPtr programName_15;
  StringPtr programName_16;
  StringPtr programName_17;
  StringPtr programName_18;
  StringPtr programName_19;
  StringPtr programName_20;
  short *__s;
  char **ppcVar4;
  ArrayDisposer *pAVar5;
  long *plVar6;
  StringPtr *pSVar7;
  RemoveConst<kj::StringPtr> *pRVar8;
  StringPtr *pSVar9;
  Arg *argSpec;
  kj *pkVar10;
  void *pvVar11;
  iterator iVar12;
  Arg *pAVar13;
  iterator iVar14;
  uint uVar15;
  kj *pkVar16;
  char *pcVar17;
  Impl *pIVar18;
  undefined8 uVar19;
  Arg *pAVar20;
  size_t __n;
  ulong uVar21;
  _Rb_tree_header *p_Var22;
  size_t sVar23;
  kj *newSize;
  ProcessContext *pPVar24;
  Arg *pAVar25;
  Arg *pAVar26;
  String *params_3;
  MainImpl *pMVar27;
  long lVar28;
  kj *pkVar29;
  StringPtr message;
  StringPtr message_00;
  StringPtr message_01;
  StringPtr message_02;
  StringPtr message_03;
  StringPtr message_04;
  StringPtr message_05;
  StringPtr message_06;
  StringPtr message_07;
  StringPtr message_08;
  StringPtr message_09;
  StringPtr message_10;
  StringPtr message_11;
  StringPtr message_12;
  StringPtr message_13;
  StringPtr message_14;
  StringPtr message_15;
  StringPtr message_16;
  StringPtr message_17;
  char c;
  StringPtr param;
  StringPtr arg;
  Vector<kj::StringPtr> arguments;
  StringPtr dummyArg;
  String *in_stack_fffffffffffffec8;
  String *in_stack_fffffffffffffed0;
  String local_128;
  undefined8 local_110;
  char *local_100;
  size_t local_f8;
  MainImpl *local_f0;
  String local_e8;
  undefined8 local_d0;
  kj *local_c8;
  char local_c0;
  undefined7 uStack_bf;
  long *local_b8;
  Arg *local_b0;
  key_type local_a8;
  undefined1 local_89 [9];
  size_t sStack_80;
  Vector<kj::StringPtr> local_78;
  long local_50;
  kj *local_48;
  ArrayPtr<const_char> local_40;
  
  pAVar25 = (Arg *)params.size_;
  pkVar16 = (kj *)params.ptr;
  local_f8 = programName.content.size_;
  local_100 = programName.content.ptr;
  local_78.builder.ptr = (StringPtr *)0x0;
  local_78.builder.pos = (RemoveConst<kj::StringPtr> *)0x0;
  local_78.builder.endPtr = (StringPtr *)0x0;
  local_f0 = this;
  local_c8 = pkVar16;
  if (pAVar25 != (Arg *)0x0) {
    pAVar20 = (Arg *)0x0;
    pMVar27 = this;
    pAVar26 = pAVar25;
    local_b0 = pAVar25;
    do {
      this = local_f0;
      pkVar10 = local_c8 + (long)pAVar20 * 0x10;
      local_a8.content.ptr._0_4_ = *(undefined4 *)pkVar10;
      local_a8.content.ptr._4_4_ = *(undefined4 *)(pkVar10 + 4);
      __s = *(short **)pkVar10;
      local_a8.content.size_._0_4_ = *(undefined4 *)(pkVar10 + 8);
      local_a8.content.size_._4_4_ = *(undefined4 *)(pkVar10 + 0xc);
      uVar21 = *(ulong *)(pkVar10 + 8);
      if (uVar21 == 3) {
        if (**(short **)pkVar10 == 0x2d2d) {
          pkVar10 = local_c8 + (long)pAVar20 * 0x10 + 0x10;
          pkVar29 = local_c8 + (long)pAVar26 * 0x10;
          __n = (long)pkVar29 - (long)pkVar10;
          pkVar16 = (kj *)(((long)__n >> 4) +
                          ((long)local_78.builder.pos - (long)local_78.builder.ptr >> 4));
          if ((kj *)((long)local_78.builder.endPtr - (long)local_78.builder.ptr >> 4) < pkVar16) {
            newSize = (kj *)0x4;
            if (local_78.builder.endPtr != local_78.builder.ptr) {
              newSize = (kj *)((long)local_78.builder.endPtr - (long)local_78.builder.ptr >> 3);
            }
            if (newSize < pkVar16) {
              newSize = pkVar16;
            }
            Vector<kj::StringPtr>::setCapacity(&local_78,(size_t)newSize);
          }
          pRVar8 = local_78.builder.pos;
          if (pkVar29 != pkVar10) {
            memcpy(local_78.builder.pos,pkVar10,__n);
          }
          local_78.builder.pos = (RemoveConst<kj::StringPtr> *)((long)pRVar8 + __n);
          this = pMVar27;
          break;
        }
LAB_001ba16d:
        if (*__s == 0x2d2d) {
          local_89._1_8_ = (char *)0x0;
          sStack_80 = 0;
          pvVar11 = memchr(__s,0x3d,uVar21 - 1);
          this = local_f0;
          if (pvVar11 == (void *)0x0) {
            sStack_80 = uVar21 - 3;
          }
          else {
            sStack_80 = ((long)pvVar11 - (long)__s) - 2;
            local_50 = (long)pvVar11 + 1;
            local_48 = (kj *)(~((long)pvVar11 - (long)__s) + uVar21);
          }
          local_89._1_8_ = __s + 1;
          iVar12 = std::
                   _Rb_tree<kj::ArrayPtr<const_char>,_std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>,_std::_Select1st<std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>_>,_kj::MainBuilder::Impl::CharArrayCompare,_std::allocator<std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>_>_>
                   ::find(&(((local_f0->impl).ptr)->longOptions)._M_t,(key_type *)(local_89 + 1));
          pkVar16 = (kj *)&(((this->impl).ptr)->longOptions)._M_t._M_impl.super__Rb_tree_header;
          if (iVar12._M_node == (_Base_ptr)pkVar16) {
            if ((CONCAT44(local_a8.content.size_._4_4_,(undefined4)local_a8.content.size_) == 7) &&
               ((short)((int *)CONCAT44(local_a8.content.ptr._4_4_,local_a8.content.ptr._0_4_))[1]
                == 0x706c &&
                *(int *)CONCAT44(local_a8.content.ptr._4_4_,local_a8.content.ptr._0_4_) ==
                0x65682d2d)) {
              programName_05.content.size_ = local_f8;
              programName_05.content.ptr = local_100;
              printHelp(local_f0,programName_05);
            }
            str<char_const(&)[3],kj::ArrayPtr<char_const>&,char_const(&)[22]>
                      (&local_128,(kj *)"--",(char (*) [3])(local_89 + 1),
                       (ArrayPtr<const_char> *)": unrecognized option",(char (*) [22])pAVar25);
            if (local_128.content.size_ == 0) {
              local_128.content.ptr = "";
            }
            message_05.content.size_ = local_128.content.size_ + (local_128.content.size_ == 0);
            programName_07.content.size_ = local_f8;
            programName_07.content.ptr = local_100;
            message_05.content.ptr = local_128.content.ptr;
            usageError(local_f0,programName_07,message_05);
          }
          p_Var2 = iVar12._M_node[1]._M_left;
          if (*(char *)&p_Var2->_M_left == '\x01') {
            if (pvVar11 == (void *)0x0) {
              ppcVar4 = &(pAVar20->title).content.ptr;
              pAVar20 = (Arg *)((long)ppcVar4 + 1);
              if (pAVar26 <= pAVar20) {
LAB_001badb4:
                str<char_const(&)[3],kj::ArrayPtr<char_const>&,char_const(&)[19]>
                          (&local_128,(kj *)"--",(char (*) [3])(local_89 + 1),
                           (ArrayPtr<const_char> *)": missing argument",(char (*) [19])pAVar25);
                if (local_128.content.size_ == 0) {
                  local_128.content.ptr = "";
                }
                message_11.content.size_ = local_128.content.size_ + (local_128.content.size_ == 0);
                programName_13.content.size_ = local_f8;
                programName_13.content.ptr = local_100;
                message_11.content.ptr = local_128.content.ptr;
                usageError(local_f0,programName_13,message_11);
              }
              pkVar16 = *(kj **)(local_c8 + (long)ppcVar4 * 0x10 + 0x18);
              if ((((kj *)0x1 < pkVar16) && (pkVar16 != (kj *)0x2)) &&
                 (**(char **)(local_c8 + (long)ppcVar4 * 0x10 + 0x10) == '-')) goto LAB_001badb4;
              (*(code *)**(undefined8 **)p_Var2->_M_right->_M_parent)(&local_e8);
              pAVar5 = local_e8.content.disposer;
              sVar23 = local_e8.content.size_;
              pAVar26 = local_b0;
              if (local_e8.content.ptr._0_1_ == (_)0x1) {
                local_e8.content.size_ = 0;
                local_e8.content.disposer = (ArrayDisposer *)0x0;
                local_128.content.size_ = sVar23;
                local_128.content.disposer = pAVar5;
                local_110 = local_d0;
                local_128.content.ptr = (char *)CONCAT71(local_128.content.ptr._1_7_,1);
                str<kj::StringPtr&,char_const(&)[2],kj::StringPtr_const&,char_const(&)[3],kj::String&>
                          (&local_e8,(kj *)&local_a8,(StringPtr *)"=",
                           (char (*) [2])(local_c8 + (long)ppcVar4 * 0x10 + 0x10),
                           (StringPtr *)0x1db3ed,(char (*) [3])&local_128.content.size_,
                           in_stack_fffffffffffffec8);
                if (local_e8.content.size_ == 0) {
                  local_e8.content.ptr = "";
                }
                message_15.content.size_ = local_e8.content.size_ + (local_e8.content.size_ == 0);
                programName_17.content.size_ = local_f8;
                programName_17.content.ptr = local_100;
                message_15.content.ptr = local_e8.content.ptr;
                usageError(local_f0,programName_17,message_15);
              }
            }
            else {
              p_Var2 = p_Var2->_M_right->_M_parent;
              pkVar16 = local_48;
              (*(code *)**(undefined8 **)p_Var2)(&local_e8,p_Var2,local_50);
              pAVar5 = local_e8.content.disposer;
              sVar23 = local_e8.content.size_;
              if (local_e8.content.ptr._0_1_ == (_)0x1) {
                local_e8.content.size_ = 0;
                local_e8.content.disposer = (ArrayDisposer *)0x0;
                local_128.content.size_ = sVar23;
                local_128.content.disposer = pAVar5;
                local_110 = local_d0;
                local_128.content.ptr = (char *)CONCAT71(local_128.content.ptr._1_7_,1);
                str<kj::StringPtr&,char_const(&)[3],kj::String&>
                          (&local_e8,(kj *)&local_a8,(StringPtr *)0x1db3ed,
                           (char (*) [3])&local_128.content.size_,(String *)pAVar25);
                if (local_e8.content.size_ == 0) {
                  local_e8.content.ptr = "";
                }
                message_09.content.size_ = local_e8.content.size_ + (local_e8.content.size_ == 0);
                programName_11.content.size_ = local_f8;
                programName_11.content.ptr = local_100;
                message_09.content.ptr = local_e8.content.ptr;
                usageError(local_f0,programName_11,message_09);
              }
            }
          }
          else {
            if (pvVar11 != (void *)0x0) {
              str<char_const(&)[3],kj::ArrayPtr<char_const>&,char_const(&)[37]>
                        (&local_128,(kj *)"--",(char (*) [3])(local_89 + 1),
                         (ArrayPtr<const_char> *)": option does not accept an argument",
                         (char (*) [37])pAVar25);
              if (local_128.content.size_ == 0) {
                local_128.content.ptr = "";
              }
              message_06.content.size_ = local_128.content.size_ + (local_128.content.size_ == 0);
              programName_08.content.size_ = local_f8;
              programName_08.content.ptr = local_100;
              message_06.content.ptr = local_128.content.ptr;
              usageError(local_f0,programName_08,message_06);
            }
            (*(code *)**(undefined8 **)p_Var2->_M_right->_M_parent)(&local_e8);
            pAVar5 = local_e8.content.disposer;
            sVar23 = local_e8.content.size_;
            if (local_e8.content.ptr._0_1_ == (_)0x1) {
              local_e8.content.size_ = 0;
              local_e8.content.disposer = (ArrayDisposer *)0x0;
              local_128.content.size_ = sVar23;
              local_128.content.disposer = pAVar5;
              local_110 = local_d0;
              local_128.content.ptr = (char *)CONCAT71(local_128.content.ptr._1_7_,1);
              str<kj::StringPtr&,char_const(&)[3],kj::String&>
                        (&local_e8,(kj *)&local_a8,(StringPtr *)0x1db3ed,
                         (char (*) [3])&local_128.content.size_,(String *)pAVar25);
              if (local_e8.content.size_ == 0) {
                local_e8.content.ptr = "";
              }
              message_07.content.size_ = local_e8.content.size_ + (local_e8.content.size_ == 0);
              programName_09.content.size_ = local_f8;
              programName_09.content.ptr = local_100;
              message_07.content.ptr = local_e8.content.ptr;
              usageError(local_f0,programName_09,message_07);
            }
          }
        }
        else {
          pMVar27 = local_f0;
          if (**(char **)pkVar10 != '-') goto LAB_001ba244;
          pkVar10 = (kj *)(uVar21 - 1);
          pkVar16 = (kj *)0x1;
          do {
            local_c0 = *(char *)((long)&((ArrayPtr<const_char> *)&pkVar16->field_0x0)->ptr +
                                CONCAT44(local_a8.content.ptr._4_4_,local_a8.content.ptr._0_4_));
            pIVar18 = (this->impl).ptr;
            pAVar25 = (Arg *)(pIVar18->shortOptions)._M_t._M_impl.super__Rb_tree_header._M_header.
                             _M_parent;
            pAVar26 = pAVar25;
            if (pAVar25 == (Arg *)0x0) {
LAB_001baa51:
              str<char_const(&)[2],char&,char_const(&)[22]>
                        (&local_128,(kj *)0x1dcaee,(char (*) [2])&local_c0,": unrecognized option",
                         (char (*) [22])pAVar26);
              if (local_128.content.size_ == 0) {
                local_128.content.ptr = "";
              }
              message_01.content.size_ = local_128.content.size_ + (local_128.content.size_ == 0);
              programName_02.content.size_ = local_f8;
              programName_02.content.ptr = local_100;
              message_01.content.ptr = local_128.content.ptr;
              usageError(local_f0,programName_02,message_01);
            }
            p_Var22 = &(pIVar18->shortOptions)._M_t._M_impl.super__Rb_tree_header;
            pAVar13 = (Arg *)p_Var22;
            do {
              cVar1 = (char)pAVar25->minCount;
              params_3 = (String *)(ulong)(cVar1 < local_c0);
              if (local_c0 <= cVar1) {
                pAVar13 = pAVar25;
              }
              pAVar25 = (Arg *)(&(pAVar25->callback).impl.disposer)[(long)params_3];
            } while (pAVar25 != (Arg *)0x0);
            pAVar26 = (Arg *)0x0;
            if ((pAVar13 == (Arg *)p_Var22) || (local_c0 < (char)pAVar13->minCount))
            goto LAB_001baa51;
            p_Var2 = (_Base_ptr)pAVar13[1].title.content.ptr;
            if (*(char *)&p_Var2->_M_left == '\x01') {
              pkVar16 = (kj *)(ulong)((int)pkVar16 + 1);
              if (pkVar16 < pkVar10) {
                local_89._1_8_ =
                     (long)&((ArrayPtr<const_char> *)&pkVar16->field_0x0)->ptr +
                     CONCAT44(local_a8.content.ptr._4_4_,local_a8.content.ptr._0_4_);
                pkVar16 = (kj *)(uVar21 - (long)pkVar16);
                sStack_80 = (size_t)pkVar16;
                (*(code *)**(undefined8 **)p_Var2->_M_right->_M_parent)(&local_e8);
                pAVar5 = local_e8.content.disposer;
                sVar23 = local_e8.content.size_;
                pAVar26 = local_b0;
                if (local_e8.content.ptr._0_1_ == (_)0x1) {
                  local_e8.content.size_ = 0;
                  local_e8.content.disposer = (ArrayDisposer *)0x0;
                  local_128.content.size_ = sVar23;
                  local_128.content.disposer = pAVar5;
                  local_110 = local_d0;
                  local_128.content.ptr = (char *)CONCAT71(local_128.content.ptr._1_7_,1);
                  str<char_const(&)[2],char&,char_const(&)[2],kj::StringPtr&,char_const(&)[3],kj::String&>
                            (&local_e8,(kj *)0x1dcaee,(char (*) [2])&local_c0," ",
                             (char (*) [2])(local_89 + 1),(StringPtr *)0x1db3ed,
                             (char (*) [3])&local_128.content.size_,in_stack_fffffffffffffed0);
                  if (local_e8.content.size_ == 0) {
                    local_e8.content.ptr = "";
                  }
                  message_14.content.size_ = local_e8.content.size_ + (local_e8.content.size_ == 0);
                  programName_16.content.size_ = local_f8;
                  programName_16.content.ptr = local_100;
                  message_14.content.ptr = local_e8.content.ptr;
                  usageError(local_f0,programName_16,message_14);
                }
                break;
              }
              ppcVar4 = &(pAVar20->title).content.ptr;
              pAVar20 = (Arg *)((long)ppcVar4 + 1);
              if (pAVar20 < local_b0) {
                pkVar16 = *(kj **)(local_c8 + (long)ppcVar4 * 0x10 + 0x18);
                if (((pkVar16 < (kj *)0x2) || (pkVar16 == (kj *)0x2)) ||
                   (**(char **)(local_c8 + (long)ppcVar4 * 0x10 + 0x10) != '-')) {
                  (*(code *)**(undefined8 **)p_Var2->_M_right->_M_parent)(&local_e8);
                  pAVar5 = local_e8.content.disposer;
                  sVar23 = local_e8.content.size_;
                  pAVar26 = local_b0;
                  if (local_e8.content.ptr._0_1_ == (_)0x1) {
                    local_e8.content.size_ = 0;
                    local_e8.content.disposer = (ArrayDisposer *)0x0;
                    local_128.content.size_ = sVar23;
                    local_128.content.disposer = pAVar5;
                    local_110 = local_d0;
                    local_128.content.ptr = (char *)CONCAT71(local_128.content.ptr._1_7_,1);
                    str<char_const(&)[2],char&,char_const(&)[2],kj::StringPtr_const&,char_const(&)[3],kj::String&>
                              (&local_e8,(kj *)0x1dcaee,(char (*) [2])&local_c0," ",
                               (char (*) [2])(local_c8 + (long)ppcVar4 * 0x10 + 0x10),
                               (StringPtr *)0x1db3ed,(char (*) [3])&local_128.content.size_,
                               in_stack_fffffffffffffed0);
                    if (local_e8.content.size_ == 0) {
                      local_e8.content.ptr = "";
                    }
                    message_13.content.size_ =
                         local_e8.content.size_ + (local_e8.content.size_ == 0);
                    programName_15.content.size_ = local_f8;
                    programName_15.content.ptr = local_100;
                    message_13.content.ptr = local_e8.content.ptr;
                    usageError(local_f0,programName_15,message_13);
                  }
                  break;
                }
              }
              str<char_const(&)[2],char&,char_const(&)[19]>
                        (&local_128,(kj *)0x1dcaee,(char (*) [2])&local_c0,": missing argument",
                         (char (*) [19])0x0);
              if (local_128.content.size_ == 0) {
                local_128.content.ptr = "";
              }
              message_08.content.size_ = local_128.content.size_ + (local_128.content.size_ == 0);
              programName_10.content.size_ = local_f8;
              programName_10.content.ptr = local_100;
              message_08.content.ptr = local_128.content.ptr;
              usageError(local_f0,programName_10,message_08);
            }
            (*(code *)**(undefined8 **)p_Var2->_M_right->_M_parent)(&local_e8);
            pAVar5 = local_e8.content.disposer;
            sVar23 = local_e8.content.size_;
            if (local_e8.content.ptr._0_1_ == (_)0x1) {
              local_e8.content.size_ = 0;
              local_e8.content.disposer = (ArrayDisposer *)0x0;
              local_128.content.size_ = sVar23;
              local_128.content.disposer = pAVar5;
              local_110 = local_d0;
              local_128.content.ptr = (char *)CONCAT71(local_128.content.ptr._1_7_,1);
              str<char_const(&)[2],char&,char_const(&)[3],kj::String&>
                        (&local_e8,(kj *)0x1dcaee,(char (*) [2])&local_c0,": ",
                         (char (*) [3])&local_128.content.size_,params_3);
              if (local_e8.content.size_ == 0) {
                local_e8.content.ptr = "";
              }
              message_03.content.size_ = local_e8.content.size_ + (local_e8.content.size_ == 0);
              programName_04.content.size_ = local_f8;
              programName_04.content.ptr = local_100;
              message_03.content.ptr = local_e8.content.ptr;
              usageError(local_f0,programName_04,message_03);
            }
            pkVar16 = (kj *)(ulong)((int)pkVar16 + 1);
            uVar21 = CONCAT44(local_a8.content.size_._4_4_,(undefined4)local_a8.content.size_);
            pkVar10 = (kj *)(uVar21 - 1);
            pAVar26 = local_b0;
          } while (pkVar16 < pkVar10);
        }
      }
      else {
        if (2 < uVar21) goto LAB_001ba16d;
LAB_001ba244:
        this = pMVar27;
        pIVar18 = (this->impl).ptr;
        if ((pIVar18->subCommands)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          iVar14 = std::
                   _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
                   ::find(&(pIVar18->subCommands)._M_t,&local_a8);
          pIVar18 = (this->impl).ptr;
          p_Var22 = &(pIVar18->subCommands)._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)iVar14._M_node != p_Var22) {
            (*(code *)**(undefined8 **)iVar14._M_node[1]._M_right)(&local_c0);
            local_e8.content.size_ = local_f8 - 1;
            local_e8.content.ptr = local_100;
            local_40.ptr = (char *)CONCAT71(local_40.ptr._1_7_,0x20);
            local_89._1_8_ = CONCAT44(local_a8.content.ptr._4_4_,local_a8.content.ptr._0_4_);
            sStack_80 = CONCAT44(local_a8.content.size_._4_4_,(undefined4)local_a8.content.size_) -
                        1;
            _::concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>>
                      (&local_128,(_ *)&local_e8,&local_40,(FixedArray<char,_1UL> *)(local_89 + 1),
                       (ArrayPtr<const_char> *)pAVar25);
            pcVar17 = local_128.content.ptr;
            if (local_128.content.size_ == 0) {
              pcVar17 = "";
            }
            ppcVar4 = &(pAVar20->title).content.ptr;
            (**(code **)*local_b8)
                      (local_b8,pcVar17,local_128.content.size_ + (local_128.content.size_ == 0),
                       local_c8 + (long)ppcVar4 * 0x10 + 0x10,
                       (long)pAVar26 - (long)((long)ppcVar4 + 1));
            sVar23 = local_128.content.size_;
            pcVar17 = local_128.content.ptr;
            if (local_128.content.ptr != (char *)0x0) {
              local_128.content.ptr = (char *)0x0;
              local_128.content.size_ = 0;
              (*(code *)**(undefined8 **)local_128.content.disposer)
                        (local_128.content.disposer,pcVar17,1,sVar23,sVar23,0);
            }
            plVar6 = local_b8;
            if (local_b8 != (long *)0x0) {
              local_b8 = (long *)0x0;
              (*(code *)**(undefined8 **)CONCAT71(uStack_bf,local_c0))
                        ((undefined8 *)CONCAT71(uStack_bf,local_c0),
                         (long)plVar6 + *(long *)(*plVar6 + -0x10));
            }
            goto LAB_001ba6d1;
          }
          if ((CONCAT44(local_a8.content.size_._4_4_,(undefined4)local_a8.content.size_) != 5) ||
             (*(int *)CONCAT44(local_a8.content.ptr._4_4_,local_a8.content.ptr._0_4_) != 0x706c6568)
             ) {
            str<kj::StringPtr&,char_const(&)[18]>
                      (&local_128,(kj *)&local_a8,(StringPtr *)": unknown command",
                       (char (*) [18])p_Var22);
            if (local_128.content.size_ == 0) {
              local_128.content.ptr = "";
            }
            message_16.content.size_ = local_128.content.size_ + (local_128.content.size_ == 0);
            programName_19.content.size_ = local_f8;
            programName_19.content.ptr = local_100;
            message_16.content.ptr = local_128.content.ptr;
            usageError(local_f0,programName_19,message_16);
          }
          ppcVar4 = &(pAVar20->title).content.ptr;
          if (pAVar26 <= (Arg *)((long)ppcVar4 + 1U)) {
            programName_18.content.size_ = local_f8;
            programName_18.content.ptr = local_100;
            printHelp(this,programName_18);
          }
          pkVar16 = local_c8 + (long)ppcVar4 * 0x10 + 0x10;
          iVar14 = std::
                   _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
                   ::find(&(pIVar18->subCommands)._M_t,(key_type *)pkVar16);
          pIVar18 = (this->impl).ptr;
          if ((_Rb_tree_header *)iVar14._M_node ==
              &(pIVar18->subCommands)._M_t._M_impl.super__Rb_tree_header) {
            if ((*(long *)(pkVar16 + 8) != 5) || (**(int **)pkVar16 != 0x706c6568)) {
              str<kj::StringPtr_const&,char_const(&)[18]>
                        (&local_128,pkVar16,(StringPtr *)": unknown command",(char (*) [18])pIVar18)
              ;
              if (local_128.content.size_ == 0) {
                local_128.content.ptr = "";
              }
              message_17.content.size_ = local_128.content.size_ + (local_128.content.size_ == 0);
              programName_20.content.size_ = local_f8;
              programName_20.content.ptr = local_100;
              message_17.content.ptr = local_128.content.ptr;
              usageError(local_f0,programName_20,message_17);
            }
            pAVar25 = (Arg *)(ulong)((int)pAVar20 + 2);
            if (local_b0 <= pAVar25) goto LAB_001bb27b;
            uVar15 = 0;
            goto LAB_001bb196;
          }
          (*(code *)**(undefined8 **)iVar14._M_node[1]._M_right)(&local_c0);
          local_40.ptr = "--help";
          local_40.size_ = 7;
          local_e8.content.size_ = local_f8 - 1;
          local_e8.content.ptr = local_100;
          local_89[0] = 0x20;
          local_89._1_8_ = *(undefined8 *)pkVar16;
          sStack_80 = *(long *)(pkVar16 + 8) - 1;
          _::concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>>
                    (&local_128,(_ *)&local_e8,(ArrayPtr<const_char> *)local_89,
                     (FixedArray<char,_1UL> *)(local_89 + 1),(ArrayPtr<const_char> *)pAVar25);
          pcVar17 = local_128.content.ptr;
          if (local_128.content.size_ == 0) {
            pcVar17 = "";
          }
          (**(code **)*local_b8)
                    (local_b8,pcVar17,local_128.content.size_ + (local_128.content.size_ == 0),
                     &local_40,1);
          sVar23 = local_128.content.size_;
          pcVar17 = local_128.content.ptr;
          if (local_128.content.ptr != (char *)0x0) {
            local_128.content.ptr = (char *)0x0;
            local_128.content.size_ = 0;
            (*(code *)**(undefined8 **)local_128.content.disposer)
                      (local_128.content.disposer,pcVar17,1,sVar23,sVar23,0);
          }
          plVar6 = local_b8;
          if (local_b8 != (long *)0x0) {
            local_b8 = (long *)0x0;
            (*(code *)**(undefined8 **)CONCAT71(uStack_bf,local_c0))
                      ((undefined8 *)CONCAT71(uStack_bf,local_c0),
                       (long)plVar6 + *(long *)(*plVar6 + -0x10));
          }
          goto LAB_001ba6d1;
        }
        if (local_78.builder.pos == local_78.builder.endPtr) {
          sVar23 = (long)local_78.builder.pos - (long)local_78.builder.ptr >> 3;
          if (local_78.builder.pos == local_78.builder.ptr) {
            sVar23 = 4;
          }
          pkVar16 = (kj *)local_78.builder.ptr;
          Vector<kj::StringPtr>::setCapacity(&local_78,sVar23);
        }
        *(undefined4 *)&((local_78.builder.pos)->content).ptr = local_a8.content.ptr._0_4_;
        *(undefined4 *)((long)local_78.builder.pos + 4) = local_a8.content.ptr._4_4_;
        *(undefined4 *)((long)local_78.builder.pos + 8) = (undefined4)local_a8.content.size_;
        *(undefined4 *)((long)local_78.builder.pos + 0xc) = local_a8.content.size_._4_4_;
        local_78.builder.pos = (RemoveConst<kj::StringPtr> *)((long)local_78.builder.pos + 0x10);
      }
      pAVar20 = (Arg *)((long)&(pAVar20->title).content.ptr + 1);
      pMVar27 = this;
    } while (pAVar20 < pAVar26);
  }
  pIVar18 = (this->impl).ptr;
  if ((pIVar18->subCommands)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    programName_06.content.size_ = local_f8;
    programName_06.content.ptr = local_100;
    message_04.content.size_ = 0x10;
    message_04.content.ptr = "missing command";
    usageError(this,programName_06,message_04);
  }
  pAVar26 = (pIVar18->args).builder.ptr;
  pAVar20 = (pIVar18->args).builder.pos;
  pkVar10 = (kj *)local_78.builder.ptr;
  if (pAVar26 != pAVar20) {
    pkVar16 = (kj *)0x0;
    pAVar13 = pAVar26;
    do {
      uVar15 = (int)pkVar16 + pAVar13->minCount;
      pkVar16 = (kj *)(ulong)uVar15;
      pAVar13 = pAVar13 + 1;
    } while (pAVar13 != pAVar20);
    if (pAVar26 != pAVar20) {
      local_c8 = (kj *)CONCAT44(local_c8._4_4_,uVar15);
      local_b0 = pAVar20;
      do {
        if (pAVar26->minCount == 0) {
          uVar15 = 0;
        }
        else {
          uVar15 = 0;
          do {
            if (pkVar10 == (kj *)local_78.builder.pos) {
              str<char_const(&)[18],kj::StringPtr&>
                        (&local_128,(kj *)"missing argument ",(char (*) [18])pAVar26,
                         (StringPtr *)pkVar16);
              if (local_128.content.size_ == 0) {
                local_128.content.ptr = "";
              }
              message_00.content.size_ = local_128.content.size_ + (local_128.content.size_ == 0);
              programName_01.content.size_ = local_f8;
              programName_01.content.ptr = local_100;
              message_00.content.ptr = local_128.content.ptr;
              usageError(local_f0,programName_01,message_00);
            }
            pkVar16 = *(kj **)(pkVar10 + 8);
            p_Var2 = (_Base_ptr)(pAVar26->callback).impl.ptr;
            (*(code *)**(undefined8 **)p_Var2)(&local_e8,p_Var2,*(undefined8 *)pkVar10);
            local_128.content.disposer = local_e8.content.disposer;
            sVar23 = local_e8.content.size_;
            if (local_e8.content.ptr._0_1_ == (_)0x1) {
              local_e8.content.size_ = 0;
              local_e8.content.disposer = (ArrayDisposer *)0x0;
              local_128.content.size_ = sVar23;
              local_110 = local_d0;
              local_128.content.ptr = (char *)CONCAT71(local_128.content.ptr._1_7_,1);
              str<kj::StringPtr&,char_const(&)[3],kj::String&>
                        (&local_e8,pkVar10,(StringPtr *)0x1db3ed,
                         (char (*) [3])&local_128.content.size_,(String *)pAVar25);
              if (local_e8.content.size_ == 0) {
                local_e8.content.ptr = "";
              }
              message.content.size_ = local_e8.content.size_ + (local_e8.content.size_ == 0);
              programName_00.content.size_ = local_f8;
              programName_00.content.ptr = local_100;
              message.content.ptr = local_e8.content.ptr;
              usageError(local_f0,programName_00,message);
            }
            pkVar10 = pkVar10 + 0x10;
            uVar15 = uVar15 + 1;
          } while (uVar15 < pAVar26->minCount);
          local_c8 = (kj *)CONCAT44(local_c8._4_4_,(int)local_c8 - uVar15);
        }
        if (uVar15 < pAVar26->maxCount) {
          uVar21 = (ulong)local_c8 & 0xffffffff;
          lVar28 = -(long)pkVar10;
          do {
            if ((long)&((local_78.builder.pos)->content).ptr + lVar28 >> 4 <= (long)uVar21) break;
            pkVar16 = *(kj **)(pkVar10 + 8);
            p_Var2 = (_Base_ptr)(pAVar26->callback).impl.ptr;
            (*(code *)**(undefined8 **)p_Var2)(&local_e8,p_Var2,*(undefined8 *)pkVar10);
            local_128.content.disposer = local_e8.content.disposer;
            sVar23 = local_e8.content.size_;
            if (local_e8.content.ptr._0_1_ == (_)0x1) {
              local_e8.content.size_ = 0;
              local_e8.content.disposer = (ArrayDisposer *)0x0;
              local_128.content.size_ = sVar23;
              local_110 = local_d0;
              local_128.content.ptr = (char *)CONCAT71(local_128.content.ptr._1_7_,1);
              str<kj::StringPtr&,char_const(&)[3],kj::String&>
                        (&local_e8,pkVar10,(StringPtr *)0x1db3ed,
                         (char (*) [3])&local_128.content.size_,(String *)pAVar25);
              if (local_e8.content.size_ == 0) {
                local_e8.content.ptr = "";
              }
              message_02.content.size_ = local_e8.content.size_ + (local_e8.content.size_ == 0);
              programName_03.content.size_ = local_f8;
              programName_03.content.ptr = local_100;
              message_02.content.ptr = local_e8.content.ptr;
              usageError(local_f0,programName_03,message_02);
            }
            pkVar10 = pkVar10 + 0x10;
            uVar15 = uVar15 + 1;
            lVar28 = lVar28 + -0x10;
          } while (uVar15 < pAVar26->maxCount);
        }
        pAVar26 = pAVar26 + 1;
        this = local_f0;
      } while (pAVar26 != local_b0);
    }
  }
  if (pkVar10 < local_78.builder.pos) {
    str<kj::StringPtr&,char_const(&)[21]>
              (&local_128,pkVar10,(StringPtr *)": too many arguments",(char (*) [21])pkVar16);
    if (local_128.content.size_ == 0) {
      local_128.content.ptr = "";
    }
    message_10.content.size_ = local_128.content.size_ + (local_128.content.size_ == 0);
    programName_12.content.size_ = local_f8;
    programName_12.content.ptr = local_100;
    message_10.content.ptr = local_128.content.ptr;
    usageError(local_f0,programName_12,message_10);
  }
  pIVar18 = (this->impl).ptr;
  if ((pIVar18->finalCallback).ptr.isSet == true) {
    (**((pIVar18->finalCallback).ptr.field_1.value.impl.ptr)->_vptr_Iface)(&local_e8);
    pAVar5 = local_e8.content.disposer;
    pcVar17 = (char *)local_e8.content.size_;
    if (local_e8.content.ptr._0_1_ == (_)0x1) {
      local_128.content.ptr = (char *)CONCAT71(local_128.content.ptr._1_7_,1);
      local_e8.content.disposer = (ArrayDisposer *)0x0;
      local_e8.content.size_ = 0;
      if (pAVar5 == (ArrayDisposer *)0x0) {
        pcVar17 = "";
      }
      message_12.content.size_ = pAVar5 + (pAVar5 == (ArrayDisposer *)0x0);
      programName_14.content.size_ = local_f8;
      programName_14.content.ptr = local_100;
      message_12.content.ptr = pcVar17;
      usageError(local_f0,programName_14,message_12);
    }
  }
LAB_001ba6d1:
  pSVar9 = local_78.builder.endPtr;
  pRVar8 = local_78.builder.pos;
  pSVar7 = local_78.builder.ptr;
  if ((kj *)local_78.builder.ptr != (kj *)0x0) {
    local_78.builder.ptr = (StringPtr *)0x0;
    local_78.builder.pos = (RemoveConst<kj::StringPtr> *)0x0;
    local_78.builder.endPtr = (StringPtr *)0x0;
    (*(code *)**(undefined8 **)local_78.builder.disposer)
              (local_78.builder.disposer,pSVar7,0x10,(long)pRVar8 - (long)pSVar7 >> 4,
               (long)pSVar9 - (long)pSVar7 >> 4,0);
  }
  return;
LAB_001bb196:
  do {
    if (*(long *)(local_c8 + (long)pAVar25 * 0x10 + 8) == 7) {
      piVar3 = *(int **)(local_c8 + (long)pAVar25 * 0x10);
      if ((short)piVar3[1] != 0x706c || *piVar3 != 0x65682d2d) break;
    }
    else if ((*(long *)(local_c8 + (long)pAVar25 * 0x10 + 8) != 5) ||
            (**(int **)(local_c8 + (long)pAVar25 * 0x10) != 0x706c6568)) break;
    pAVar25 = (Arg *)(ulong)((int)pAVar20 + 3 + uVar15);
    uVar15 = uVar15 + 1;
  } while (pAVar25 < local_b0);
  if (uVar15 == 0) {
LAB_001bb27b:
    pPVar24 = pIVar18->context;
    pIVar18 = (Impl *)(pPVar24->_vptr_ProcessContext + 5);
    uVar19 = 0x27;
    pcVar17 = "Help about help?  We must go deeper...";
  }
  else {
    if (uVar15 == 1) goto LAB_001bb293;
    if (uVar15 == 2) {
      pPVar24 = pIVar18->context;
      pIVar18 = (Impl *)(pPVar24->_vptr_ProcessContext + 5);
      uVar19 = 0x2a;
      pcVar17 = "Help, I\'m trapped in a help text factory!";
    }
    else {
      pPVar24 = pIVar18->context;
      if (uVar15 < 10) {
        pIVar18 = (Impl *)(pPVar24->_vptr_ProcessContext + 4);
        uVar19 = 0x1f;
        pcVar17 = "Killed by signal 911 (SIGHELP)";
      }
      else {
        pIVar18 = (Impl *)(pPVar24->_vptr_ProcessContext + 5);
        uVar19 = 0x1d;
        pcVar17 = "How to keep an idiot busy...";
      }
    }
  }
  do {
    (*(code *)pIVar18->context)(pPVar24,pcVar17,uVar19);
LAB_001bb293:
    pPVar24 = pIVar18->context;
    pIVar18 = (Impl *)(pPVar24->_vptr_ProcessContext + 5);
    uVar19 = 0x6d;
    pcVar17 = 
    "Yo dawg, I heard you like help.  So I wrote you some help about how to use help so you can get help on help."
    ;
  } while( true );
}

Assistant:

void MainBuilder::MainImpl::operator()(StringPtr programName, ArrayPtr<const StringPtr> params) {
  Vector<StringPtr> arguments;

  for (size_t i = 0; i < params.size(); i++) {
    StringPtr param = params[i];
    if (param == "--") {
      // "--" ends option parsing.
      arguments.addAll(params.begin() + i + 1, params.end());
      break;
    } else if (param.startsWith("--")) {
      // Long option.
      ArrayPtr<const char> name;
      Maybe<StringPtr> maybeArg;
      KJ_IF_MAYBE(pos, param.findFirst('=')) {
        name = param.slice(2, *pos);
        maybeArg = param.slice(*pos + 1);
      } else {
        name = param.slice(2);
      }
      auto iter = impl->longOptions.find(name);
      if (iter == impl->longOptions.end()) {
        if (param == "--help") {
          printHelp(programName);
        } else {
          usageError(programName, str("--", name, ": unrecognized option"));
        }
      } else {
        const Impl::Option& option = *iter->second;
        if (option.hasArg) {
          // Argument expected.
          KJ_IF_MAYBE(arg, maybeArg) {
            // "--foo=blah": "blah" is the argument.
            KJ_IF_MAYBE(error, (*option.funcWithArg)(*arg).releaseError()) {
              usageError(programName, str(param, ": ", *error));
            }
          } else if (i + 1 < params.size() &&
                     !(params[i + 1].startsWith("-") && params[i + 1].size() > 1)) {
            // "--foo blah": "blah" is the argument.
            ++i;
            KJ_IF_MAYBE(error, (*option.funcWithArg)(params[i]).releaseError()) {
              usageError(programName, str(param, "=", params[i], ": ", *error));
            }
          } else {
            usageError(programName, str("--", name, ": missing argument"));
          }
        } else {
          // No argument expected.
          if (maybeArg == nullptr) {
            KJ_IF_MAYBE(error, (*option.func)().releaseError()) {
              usageError(programName, str(param, ": ", *error));
            }
          } else {
            usageError(programName, str("--", name, ": option does not accept an argument"));
          }
        }
      }
    }